

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<long_double,unsigned_char>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,longdouble *t_lhs,longdouble *c_lhs,
          uchar *c_rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  arithmetic_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  longdouble lVar4;
  longdouble lVar5;
  Boxed_Value BVar6;
  string local_48;
  
  switch(t_oper) {
  case equals:
    b = (longdouble)*c_rhs == *c_lhs;
    break;
  case less_than:
    lVar4 = *c_lhs;
    lVar5 = (longdouble)*c_rhs;
    goto LAB_001d87b8;
  case greater_than:
    lVar5 = *c_lhs;
    lVar4 = (longdouble)*c_rhs;
LAB_001d87b8:
    b = lVar4 < lVar5;
    break;
  case less_than_equal:
    lVar4 = *c_lhs;
    lVar5 = (longdouble)*c_rhs;
    goto LAB_001d878a;
  case greater_than_equal:
    lVar5 = *c_lhs;
    lVar4 = (longdouble)*c_rhs;
LAB_001d878a:
    b = lVar4 <= lVar5;
    break;
  case not_equal:
    b = (longdouble)*c_rhs != *c_lhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      lVar5 = *c_lhs + (longdouble)*c_rhs;
      break;
    case quotient:
      if (*c_rhs == 0) {
        this_00 = (arithmetic_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
        local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
        local_48.field_2._8_6_ = 0x6f72657a2079;
        local_48._M_string_length._0_2_ = 0xe;
        local_48._M_string_length._2_6_ = 0;
        local_48.field_2._M_local_buf[0xe] = '\0';
        exception::arithmetic_error::arithmetic_error(this_00,&local_48);
        __cxa_throw(this_00,&exception::arithmetic_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      lVar5 = *c_lhs / (longdouble)*c_rhs;
      break;
    case product:
      lVar5 = *c_lhs * (longdouble)*c_rhs;
      break;
    case difference:
      lVar5 = *c_lhs - (longdouble)*c_rhs;
      break;
    default:
      if (t_lhs == (longdouble *)0x0) {
switchD_001d873c_caseD_7:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__bad_cast_00237930;
        __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
      switch(t_oper) {
      case assign:
        lVar5 = (longdouble)*c_rhs;
        break;
      default:
        goto switchD_001d873c_caseD_7;
      case assign_product:
        lVar5 = *t_lhs * (longdouble)*c_rhs;
        break;
      case assign_sum:
        lVar5 = *t_lhs + (longdouble)*c_rhs;
        break;
      case assign_quotient:
        check_divide_by_zero<unsigned_char>(*c_rhs);
        lVar5 = *t_lhs / (longdouble)*c_rhs;
        _Var3._M_pi = extraout_RDX;
        break;
      case assign_difference:
        lVar5 = *t_lhs - (longdouble)*c_rhs;
      }
      *t_lhs = lVar5;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (t_bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (t_bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      goto LAB_001d8816;
    }
    local_48._M_dataplus._M_p = SUB108(lVar5,0);
    local_48._M_string_length._0_2_ = (undefined2)((unkuint10)lVar5 >> 0x40);
    BVar6 = detail::const_var_impl<long_double>((detail *)this,(longdouble *)&local_48);
    _Var3._M_pi = BVar6.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_001d8816;
  }
  BVar6 = const_var((chaiscript *)this,b);
  _Var3._M_pi = BVar6.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_001d8816:
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }